

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

FaceHandle __thiscall
OpenMesh::PolyConnectivity::add_face
          (PolyConnectivity *this,VertexHandle *_vertex_handles,size_t _vhs_size)

{
  vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
  *this_00;
  BaseHandle BVar1;
  VertexHandle _vh;
  pointer ppVar2;
  bool bVar3;
  BaseHandle BVar4;
  HalfedgeHandle HVar5;
  HalfedgeHandle HVar6;
  BaseHandle BVar7;
  FaceHandle _fh;
  uint uVar8;
  BaseHandle BVar9;
  Face *pFVar10;
  Vertex *pVVar11;
  pointer pAVar12;
  Halfedge *pHVar13;
  mostream *pmVar14;
  ulong uVar15;
  size_t sVar16;
  char *pcVar17;
  BaseHandle BVar18;
  size_t sVar19;
  
  this_00 = &this->edgeData_;
  if ((ulong)((long)(this->edgeData_).
                    super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->edgeData_).
                    super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) < _vhs_size) {
    std::
    vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
    ::resize(this_00,_vhs_size);
    std::
    vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
    ::resize(&this->next_cache_,_vhs_size * 6);
  }
  this->next_cache_count_ = 0;
  if (_vhs_size < 3) {
    __assert_fail("n > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x86,
                  "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                 );
  }
  sVar16 = 1;
  sVar19 = 0;
  while (_vhs_size != sVar19) {
    bVar3 = is_boundary(this,(VertexHandle)_vertex_handles[sVar19].super_BaseHandle.idx_);
    if (!bVar3) {
      pcVar17 = "PolyMeshT::add_face: complex vertex\n";
      goto LAB_001ac134;
    }
    BVar4.idx_ = (int)find_halfedge(this,_vertex_handles[sVar19].super_BaseHandle.idx_,
                                    _vertex_handles[sVar16].super_BaseHandle.idx_);
    (this->edgeData_).
    super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
    ._M_impl.super__Vector_impl_data._M_start[sVar19].halfedge_handle.super_BaseHandle.idx_ =
         BVar4.idx_;
    pAVar12 = (this->edgeData_).
              super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    BVar4.idx_ = pAVar12[sVar19].halfedge_handle.super_BaseHandle.idx_;
    pAVar12[sVar19].is_new = BVar4.idx_ == -1;
    pAVar12[sVar19].needs_adjust = false;
    if ((BVar4.idx_ != -1) &&
       (bVar3 = ArrayKernel::is_boundary(&this->super_ArrayKernel,(HalfedgeHandle)BVar4.idx_),
       !bVar3)) {
      pcVar17 = "PolyMeshT::add_face: complex edge\n";
      goto LAB_001ac134;
    }
    sVar19 = sVar19 + 1;
    sVar16 = sVar16 + 1;
    if (sVar16 == _vhs_size) {
      sVar16 = 0;
    }
  }
  uVar15 = 1;
  sVar16 = 0;
  do {
    if (sVar16 == _vhs_size) {
      uVar15 = 1;
      for (sVar16 = 0; _vhs_size != sVar16; sVar16 = sVar16 + 1) {
        if ((this_00->
            super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
            )._M_impl.super__Vector_impl_data._M_start[sVar16].is_new == true) {
          BVar4.idx_ = (int)ArrayKernel::new_edge
                                      (&this->super_ArrayKernel,
                                       _vertex_handles[sVar16].super_BaseHandle.idx_,
                                       _vertex_handles[uVar15].super_BaseHandle.idx_);
          (this->edgeData_).
          super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar16].halfedge_handle.super_BaseHandle.idx_ =
               BVar4.idx_;
        }
        uVar15 = (uVar15 + 1) % _vhs_size;
      }
      _fh = ArrayKernel::new_face(&this->super_ArrayKernel);
      BVar4.idx_ = (this->edgeData_).
                   super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start[_vhs_size - 1].halfedge_handle.
                   super_BaseHandle.idx_;
      pFVar10 = ArrayKernel::face(&this->super_ArrayKernel,_fh);
      (pFVar10->halfedge_handle_).super_BaseHandle.idx_ = BVar4.idx_;
      uVar15 = 1;
      sVar16 = 0;
      do {
        if (_vhs_size == sVar16) {
          for (uVar15 = 0; uVar15 < this->next_cache_count_; uVar15 = uVar15 + 1) {
            ppVar2 = (this->next_cache_).
                     super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ArrayKernel::set_next_halfedge_handle
                      (&this->super_ArrayKernel,
                       (HalfedgeHandle)ppVar2[uVar15].first.super_BaseHandle.idx_,
                       (HalfedgeHandle)ppVar2[uVar15].second.super_BaseHandle.idx_);
          }
          for (sVar16 = 0; _vhs_size != sVar16; sVar16 = sVar16 + 1) {
            if ((this_00->
                super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                )._M_impl.super__Vector_impl_data._M_start[sVar16].needs_adjust == true) {
              adjust_outgoing_halfedge
                        (this,(VertexHandle)_vertex_handles[sVar16].super_BaseHandle.idx_);
            }
          }
          return (FaceHandle)_fh.super_BaseHandle.idx_;
        }
        pAVar12 = (this_00->
                  super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        BVar4.idx_ = pAVar12[sVar16].halfedge_handle.super_BaseHandle.idx_;
        if (BVar4.idx_ == -1) {
          __assert_fail("inner_prev.is_valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xe1,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        BVar1.idx_ = pAVar12[uVar15].halfedge_handle.super_BaseHandle.idx_;
        if (BVar1.idx_ == 0xffffffff) {
          __assert_fail("inner_next.is_valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xe2,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        _vh.super_BaseHandle.idx_ = (BaseHandle)_vertex_handles[uVar15].super_BaseHandle.idx_;
        uVar8 = pAVar12[sVar16].is_new + 2;
        if (pAVar12[uVar15].is_new == false) {
          uVar8 = (uint)pAVar12[sVar16].is_new;
        }
        if (uVar8 == 0) {
          HVar5 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_vh);
          pAVar12 = (this->edgeData_).
                    super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pAVar12[uVar15].needs_adjust = HVar5.super_BaseHandle.idx_ == (BaseHandle)BVar1.idx_;
        }
        else {
          BVar18.idx_ = (-(BVar1.idx_ & 1U) | 1) + BVar1.idx_;
          if (BVar18.idx_ == -1) {
            __assert_fail("outer_prev.is_valid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                          ,0xed,
                          "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                         );
          }
          BVar7.idx_ = (-(BVar4.idx_ & 1U) | 1) + BVar4.idx_;
          if (BVar7.idx_ == -1) {
            __assert_fail("outer_next.is_valid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                          ,0xee,
                          "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                         );
          }
          if (uVar8 == 3) {
            HVar5 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_vh);
            if (HVar5.super_BaseHandle.idx_ == -1) {
              pVVar11 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
              (pVVar11->halfedge_handle_).super_BaseHandle.idx_ = BVar7.idx_;
              uVar8 = this->next_cache_count_;
              this->next_cache_count_ = uVar8 + 1;
              ppVar2 = (this->next_cache_).
                       super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar2[uVar8].first.super_BaseHandle.idx_ = BVar18.idx_;
              ppVar2[uVar8].second.super_BaseHandle.idx_ = BVar7.idx_;
            }
            else {
              HVar5 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_vh);
              BVar9.idx_ = (int)ArrayKernel::prev_halfedge_handle
                                          (&this->super_ArrayKernel,HVar5.super_BaseHandle.idx_);
              if (BVar9.idx_ == -1) {
                __assert_fail("boundary_prev.is_valid()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                              ,0x10b,
                              "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                             );
              }
              if (HVar5.super_BaseHandle.idx_ == -1) {
                __assert_fail("boundary_next.is_valid()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                              ,0x10c,
                              "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                             );
              }
              uVar8 = this->next_cache_count_;
              this->next_cache_count_ = uVar8 + 1;
              ppVar2 = (this->next_cache_).
                       super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar2[uVar8].first.super_BaseHandle.idx_ = BVar9.idx_;
              ppVar2[uVar8].second.super_BaseHandle.idx_ = BVar7.idx_;
              uVar8 = this->next_cache_count_;
              this->next_cache_count_ = uVar8 + 1;
              ppVar2 = (this->next_cache_).
                       super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar2[uVar8].first.super_BaseHandle.idx_ = BVar18.idx_;
              ppVar2[uVar8].second.super_BaseHandle.idx_ = (int)HVar5.super_BaseHandle.idx_;
            }
          }
          else {
            if (uVar8 == 2) {
              BVar7.idx_ = (int)ArrayKernel::next_halfedge_handle
                                          (&this->super_ArrayKernel,BVar4.idx_);
              if (BVar7.idx_ == -1) {
                __assert_fail("boundary_next.is_valid()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                              ,0xfc,
                              "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                             );
              }
              uVar8 = this->next_cache_count_;
              this->next_cache_count_ = uVar8 + 1;
              ppVar2 = (this->next_cache_).
                       super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar2[uVar8].first.super_BaseHandle.idx_ = BVar18.idx_;
              ppVar2[uVar8].second.super_BaseHandle.idx_ = BVar7.idx_;
            }
            else {
              BVar18.idx_ = (int)ArrayKernel::prev_halfedge_handle
                                           (&this->super_ArrayKernel,BVar1.idx_);
              if (BVar18.idx_ == -1) {
                __assert_fail("boundary_prev.is_valid()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                              ,0xf5,
                              "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                             );
              }
              uVar8 = this->next_cache_count_;
              this->next_cache_count_ = uVar8 + 1;
              ppVar2 = (this->next_cache_).
                       super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar2[uVar8].first.super_BaseHandle.idx_ = BVar18.idx_;
              ppVar2[uVar8].second.super_BaseHandle.idx_ = BVar7.idx_;
            }
            pVVar11 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
            (pVVar11->halfedge_handle_).super_BaseHandle.idx_ = BVar7.idx_;
          }
          uVar8 = this->next_cache_count_;
          this->next_cache_count_ = uVar8 + 1;
          ppVar2 = (this->next_cache_).
                   super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar2[uVar8].first.super_BaseHandle.idx_ = BVar4.idx_;
          ppVar2[uVar8].second.super_BaseHandle.idx_ = BVar1.idx_;
          pAVar12 = (this->edgeData_).
                    super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        pHVar13 = ArrayKernel::halfedge
                            (&this->super_ArrayKernel,
                             (HalfedgeHandle)pAVar12[sVar16].halfedge_handle.super_BaseHandle.idx_);
        (pHVar13->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
             (int)_fh.super_BaseHandle.idx_;
        sVar16 = sVar16 + 1;
        uVar15 = (uVar15 + 1) % _vhs_size;
      } while( true );
    }
    pAVar12 = (this_00->
              super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((pAVar12[sVar16].is_new == false) && (pAVar12[uVar15].is_new == false)) {
      BVar4.idx_ = pAVar12[sVar16].halfedge_handle.super_BaseHandle.idx_;
      BVar1.idx_ = pAVar12[uVar15].halfedge_handle.super_BaseHandle.idx_;
      HVar5 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,(HalfedgeHandle)BVar4.idx_)
      ;
      if (HVar5.super_BaseHandle.idx_ != (BaseHandle)BVar1.idx_) {
        BVar18.idx_ = (-(BVar1.idx_ & 1U) | 1) + BVar1.idx_;
        do {
          do {
            HVar5 = ArrayKernel::next_halfedge_handle
                              (&this->super_ArrayKernel,(HalfedgeHandle)BVar18.idx_);
            BVar18 = (-((uint)HVar5.super_BaseHandle.idx_ & 1) | 1) + HVar5.super_BaseHandle.idx_;
            bVar3 = ArrayKernel::is_boundary(&this->super_ArrayKernel,(HalfedgeHandle)BVar18.idx_);
          } while (!bVar3);
        } while (BVar18.idx_ == BVar4.idx_);
        HVar5 = ArrayKernel::next_halfedge_handle
                          (&this->super_ArrayKernel,(HalfedgeHandle)BVar18.idx_);
        bVar3 = ArrayKernel::is_boundary(&this->super_ArrayKernel,(HalfedgeHandle)BVar18.idx_);
        if (!bVar3) {
          __assert_fail("is_boundary(boundary_prev)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xb5,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        bVar3 = ArrayKernel::is_boundary(&this->super_ArrayKernel,HVar5);
        if (!bVar3) {
          __assert_fail("is_boundary(boundary_next)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xb6,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        if (HVar5.super_BaseHandle.idx_ == (BaseHandle)BVar1.idx_) {
          pcVar17 = "PolyMeshT::add_face: patch re-linking failed\n";
LAB_001ac134:
          pmVar14 = omerr();
          std::operator<<(&pmVar14->super_ostream,pcVar17);
          return (FaceHandle)InvalidFaceHandle;
        }
        HVar6 = ArrayKernel::next_halfedge_handle
                          (&this->super_ArrayKernel,(HalfedgeHandle)BVar4.idx_);
        BVar7.idx_ = (int)ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,BVar1.idx_);
        if (BVar18.idx_ == -1) {
          __assert_fail("boundary_prev.is_valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xc2,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        if (HVar6.super_BaseHandle.idx_ == -1) {
          __assert_fail("patch_start.is_valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xc3,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        if (BVar7.idx_ == -1) {
          __assert_fail("patch_end.is_valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xc4,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        if (HVar5.super_BaseHandle.idx_ == -1) {
          __assert_fail("boundary_next.is_valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xc5,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        if (BVar4.idx_ == -1) {
          __assert_fail("inner_prev.is_valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xc6,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        if (BVar1.idx_ == 0xffffffff) {
          __assert_fail("inner_next.is_valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,199,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        uVar8 = this->next_cache_count_;
        this->next_cache_count_ = uVar8 + 1;
        ppVar2 = (this->next_cache_).
                 super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar2[uVar8].first.super_BaseHandle.idx_ = BVar18.idx_;
        ppVar2[uVar8].second.super_BaseHandle.idx_ = (int)HVar6.super_BaseHandle.idx_;
        uVar8 = this->next_cache_count_;
        this->next_cache_count_ = uVar8 + 1;
        ppVar2 = (this->next_cache_).
                 super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar2[uVar8].first.super_BaseHandle.idx_ = BVar7.idx_;
        ppVar2[uVar8].second.super_BaseHandle.idx_ = (int)HVar5.super_BaseHandle.idx_;
        uVar8 = this->next_cache_count_;
        this->next_cache_count_ = uVar8 + 1;
        ppVar2 = (this->next_cache_).
                 super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar2[uVar8].first.super_BaseHandle.idx_ = BVar4.idx_;
        ppVar2[uVar8].second.super_BaseHandle.idx_ = BVar1.idx_;
      }
    }
    sVar16 = sVar16 + 1;
    uVar15 = (uVar15 + 1) % _vhs_size;
  } while( true );
}

Assistant:

PolyConnectivity::FaceHandle
PolyConnectivity::add_face(const VertexHandle* _vertex_handles, size_t _vhs_size)
{
  VertexHandle                   vh;
  size_t                         i, ii, n(_vhs_size);
  HalfedgeHandle                 inner_next, inner_prev,
                                 outer_next, outer_prev,
                                 boundary_next, boundary_prev,
                                 patch_start, patch_end;


  // Check sufficient working storage available
  if (edgeData_.size() < n)
  {
    edgeData_.resize(n);
    next_cache_.resize(6*n);
  }
  next_cache_count_ = 0;

  // don't allow degenerated faces
  assert (n > 2);

  // test for topological errors
  for (i=0, ii=1; i<n; ++i, ++ii, ii%=n)
  {
    if ( !is_boundary(_vertex_handles[i]) )
    {
      omerr() << "PolyMeshT::add_face: complex vertex\n";
      return InvalidFaceHandle;
    }

    // Initialise edge attributes
    edgeData_[i].halfedge_handle = find_halfedge(_vertex_handles[i],
                                                 _vertex_handles[ii]);
    edgeData_[i].is_new = !edgeData_[i].halfedge_handle.is_valid();
    edgeData_[i].needs_adjust = false;

    if (!edgeData_[i].is_new && !is_boundary(edgeData_[i].halfedge_handle))
    {
      omerr() << "PolyMeshT::add_face: complex edge\n";
      return InvalidFaceHandle;
    }
  }

  // re-link patches if necessary
  for (i=0, ii=1; i<n; ++i, ++ii, ii%=n)
  {
    if (!edgeData_[i].is_new && !edgeData_[ii].is_new)
    {
      inner_prev = edgeData_[i].halfedge_handle;
      inner_next = edgeData_[ii].halfedge_handle;


      if (next_halfedge_handle(inner_prev) != inner_next)
      {
        // here comes the ugly part... we have to relink a whole patch

        // search a free gap
        // free gap will be between boundary_prev and boundary_next
        outer_prev = opposite_halfedge_handle(inner_next);
        outer_next = opposite_halfedge_handle(inner_prev);
        boundary_prev = outer_prev;
        do
          boundary_prev =
            opposite_halfedge_handle(next_halfedge_handle(boundary_prev));
        while (!is_boundary(boundary_prev) || boundary_prev==inner_prev);
        boundary_next = next_halfedge_handle(boundary_prev);
        assert(is_boundary(boundary_prev));
        assert(is_boundary(boundary_next));
        // ok ?
        if (boundary_next == inner_next)
        {
          omerr() << "PolyMeshT::add_face: patch re-linking failed\n";
          return InvalidFaceHandle;
        }

        // other halfedges' handles
        patch_start = next_halfedge_handle(inner_prev);
        patch_end   = prev_halfedge_handle(inner_next);

        assert(boundary_prev.is_valid());
        assert(patch_start.is_valid());
        assert(patch_end.is_valid());
        assert(boundary_next.is_valid());
        assert(inner_prev.is_valid());
        assert(inner_next.is_valid());

        // relink
        next_cache_[next_cache_count_++] = std::make_pair(boundary_prev, patch_start);
        next_cache_[next_cache_count_++] = std::make_pair(patch_end, boundary_next);
        next_cache_[next_cache_count_++] = std::make_pair(inner_prev, inner_next);
      }
    }
  }

  // create missing edges
  for (i=0, ii=1; i<n; ++i, ++ii, ii%=n)
    if (edgeData_[i].is_new)
      edgeData_[i].halfedge_handle = new_edge(_vertex_handles[i], _vertex_handles[ii]);

  // create the face
  FaceHandle fh(new_face());
  set_halfedge_handle(fh, edgeData_[n-1].halfedge_handle);

  // setup halfedges
  for (i=0, ii=1; i<n; ++i, ++ii, ii%=n)
  {
    vh         = _vertex_handles[ii];

    inner_prev = edgeData_[i].halfedge_handle;
    inner_next = edgeData_[ii].halfedge_handle;
    assert(inner_prev.is_valid());
    assert(inner_next.is_valid());

    size_t id = 0;
    if (edgeData_[i].is_new)  id |= 1;
    if (edgeData_[ii].is_new) id |= 2;


    if (id)
    {
      outer_prev = opposite_halfedge_handle(inner_next);
      outer_next = opposite_halfedge_handle(inner_prev);
      assert(outer_prev.is_valid());
      assert(outer_next.is_valid());

      // set outer links
      switch (id)
      {
        case 1: // prev is new, next is old
          boundary_prev = prev_halfedge_handle(inner_next);
          assert(boundary_prev.is_valid());
          next_cache_[next_cache_count_++] = std::make_pair(boundary_prev, outer_next);
          set_halfedge_handle(vh, outer_next);
          break;

        case 2: // next is new, prev is old
          boundary_next = next_halfedge_handle(inner_prev);
          assert(boundary_next.is_valid());
          next_cache_[next_cache_count_++] = std::make_pair(outer_prev, boundary_next);
          set_halfedge_handle(vh, boundary_next);
          break;

        case 3: // both are new
          if (!halfedge_handle(vh).is_valid())
          {
            set_halfedge_handle(vh, outer_next);
            next_cache_[next_cache_count_++] = std::make_pair(outer_prev, outer_next);
          }
          else
          {
            boundary_next = halfedge_handle(vh);
            boundary_prev = prev_halfedge_handle(boundary_next);
            assert(boundary_prev.is_valid());
            assert(boundary_next.is_valid());
            next_cache_[next_cache_count_++] = std::make_pair(boundary_prev, outer_next);
            next_cache_[next_cache_count_++] = std::make_pair(outer_prev, boundary_next);
          }
          break;
      }

      // set inner link
      next_cache_[next_cache_count_++] = std::make_pair(inner_prev, inner_next);
    }
    else edgeData_[ii].needs_adjust = (halfedge_handle(vh) == inner_next);


    // set face handle
    set_face_handle(edgeData_[i].halfedge_handle, fh);
  }

  // process next halfedge cache
  for (i = 0; i < next_cache_count_; ++i)
    set_next_halfedge_handle(next_cache_[i].first, next_cache_[i].second);


  // adjust vertices' halfedge handle
  for (i=0; i<n; ++i)
    if (edgeData_[i].needs_adjust)
      adjust_outgoing_halfedge(_vertex_handles[i]);

  return fh;
}